

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

string * __thiscall higan::Buffer::ReadLine_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (pcVar3 + this->read_idx_,pcVar3 + this->write_idx_);
  if (pcVar1 != (char *)0x0) {
    pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->read_idx_;
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar3);
    pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    if (pcVar1 + (this->read_idx_ - (long)pcVar3) + 1 < pcVar2) {
      pcVar2 = pcVar1 + (this->read_idx_ - (long)pcVar3) + 1;
    }
    this->read_idx_ = (size_t)pcVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Buffer::ReadLine()
{
	std::string result;
	const char* line_end = std::find(ReadBegin(), ReadBegin() + ReadableSize(), '\n');

	if (!line_end)
	{
		return result;
	}

	size_t len = line_end - ReadBegin();
	result.append(ReadBegin(), len);
	AddReadIndex(len + 1);

	return result;
}